

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::dumpLinearizationDataInternal(QPDF *this)

{
  int iVar1;
  pointer pMVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  Pipeline *pPVar6;
  shared_ptr<Pipeline> local_70;
  shared_ptr<Pipeline> local_60;
  shared_ptr<Pipeline> local_50;
  shared_ptr<Pipeline> local_40 [2];
  shared_ptr<Pipeline> local_20;
  QPDF *local_10;
  QPDF *this_local;
  
  local_10 = this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar2);
  QPDFLogger::getInfo((QPDFLogger *)&local_20,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_20);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar2->file);
  iVar1 = (*peVar5->_vptr_InputSource[3])();
  pPVar6 = Pipeline::operator<<(peVar4,(string *)CONCAT44(extraout_var,iVar1));
  Pipeline::operator<<(pPVar6,": linearization data:\n\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_20);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar2);
  QPDFLogger::getInfo((QPDFLogger *)local_40,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_40);
  pPVar6 = Pipeline::operator<<(peVar4,"file_size: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).file_size);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"first_page_object: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).first_page_object);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"first_page_end: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).first_page_end);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"npages: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).npages);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"xref_zero_offset: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).xref_zero_offset);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"first_page: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).first_page);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"H_offset: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).H_offset);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"H_length: ");
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pPVar6 = Pipeline::operator<<(pPVar6,(pMVar2->linp).H_length);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  Pipeline::operator<<(pPVar6,"\n");
  std::shared_ptr<Pipeline>::~shared_ptr(local_40);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar2);
  QPDFLogger::getInfo((QPDFLogger *)&local_50,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_50);
  Pipeline::operator<<(peVar4,"Page Offsets Hint Table\n\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_50);
  dumpHPageOffset(this);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar2);
  QPDFLogger::getInfo((QPDFLogger *)&local_60,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_60);
  Pipeline::operator<<(peVar4,"\nShared Objects Hint Table\n\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_60);
  dumpHSharedObject(this);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (0 < (pMVar2->outline_hints).nobjects) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )pMVar2);
    QPDFLogger::getInfo((QPDFLogger *)&local_70,SUB81(peVar3,0));
    peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_70);
    Pipeline::operator<<(peVar4,"\nOutlines Hint Table\n\n");
    std::shared_ptr<Pipeline>::~shared_ptr(&local_70);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    dumpHGeneric(this,&pMVar2->outline_hints);
  }
  return;
}

Assistant:

void
QPDF::dumpLinearizationDataInternal()
{
    *m->log->getInfo() << m->file->getName() << ": linearization data:\n\n";

    *m->log->getInfo() << "file_size: " << m->linp.file_size << "\n"
                       << "first_page_object: " << m->linp.first_page_object << "\n"
                       << "first_page_end: " << m->linp.first_page_end << "\n"
                       << "npages: " << m->linp.npages << "\n"
                       << "xref_zero_offset: " << m->linp.xref_zero_offset << "\n"
                       << "first_page: " << m->linp.first_page << "\n"
                       << "H_offset: " << m->linp.H_offset << "\n"
                       << "H_length: " << m->linp.H_length << "\n"
                       << "\n";

    *m->log->getInfo() << "Page Offsets Hint Table\n\n";
    dumpHPageOffset();
    *m->log->getInfo() << "\nShared Objects Hint Table\n\n";
    dumpHSharedObject();

    if (m->outline_hints.nobjects > 0) {
        *m->log->getInfo() << "\nOutlines Hint Table\n\n";
        dumpHGeneric(m->outline_hints);
    }
}